

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclBuffer.c
# Opt level: O3

void Abc_BufReplaceBufsByInvs(Abc_Ntk_t *pNtk)

{
  Abc_Obj_t *pNode;
  int iVar1;
  Vec_Ptr_t *pVVar2;
  Mio_Gate_t *pMVar3;
  Mio_Gate_t *pMVar4;
  Abc_Obj_t *pFaninNew;
  uint uVar5;
  long lVar6;
  
  pVVar2 = pNtk->vObjs;
  if (pVVar2->nSize < 1) {
    uVar5 = 0;
  }
  else {
    lVar6 = 0;
    uVar5 = 0;
    do {
      pNode = (Abc_Obj_t *)pVVar2->pArray[lVar6];
      if (((pNode != (Abc_Obj_t *)0x0) && ((*(uint *)&pNode->field_0x14 & 0xf) == 7)) &&
         (iVar1 = Abc_NodeIsBuf(pNode), iVar1 != 0)) {
        pMVar4 = (Mio_Gate_t *)(pNode->field_5).pData;
        pMVar3 = Mio_LibraryReadBuf((Mio_Library_t *)pNtk->pManFunc);
        if (pMVar4 != pMVar3) {
          __assert_fail("pObj->pData == Mio_LibraryReadBuf((Mio_Library_t *)pNtk->pManFunc)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/scl/sclBuffer.c"
                        ,0x32e,"void Abc_BufReplaceBufsByInvs(Abc_Ntk_t *)");
        }
        pMVar4 = Mio_LibraryReadInv((Mio_Library_t *)pNtk->pManFunc);
        (pNode->field_5).pData = pMVar4;
        pFaninNew = Abc_NtkCreateNodeInv
                              (pNtk,(Abc_Obj_t *)
                                    pNode->pNtk->vObjs->pArray[*(pNode->vFanins).pArray]);
        Abc_ObjPatchFanin(pNode,(Abc_Obj_t *)pNode->pNtk->vObjs->pArray[*(pNode->vFanins).pArray],
                          pFaninNew);
        uVar5 = uVar5 + 1;
      }
      lVar6 = lVar6 + 1;
      pVVar2 = pNtk->vObjs;
    } while (lVar6 < pVVar2->nSize);
  }
  printf("Replaced %d buffers by invertor pairs.\n",(ulong)uVar5);
  return;
}

Assistant:

void Abc_BufReplaceBufsByInvs( Abc_Ntk_t * pNtk )
{
    Abc_Obj_t * pObj, * pInv;
    int i, Counter = 0;
    Abc_NtkForEachNode( pNtk, pObj, i )
    {
        if ( !Abc_NodeIsBuf(pObj) )
            continue;
        assert( pObj->pData == Mio_LibraryReadBuf((Mio_Library_t *)pNtk->pManFunc) );
        pObj->pData = Mio_LibraryReadInv((Mio_Library_t *)pNtk->pManFunc);
        pInv = Abc_NtkCreateNodeInv( pNtk, Abc_ObjFanin0(pObj) );
        Abc_ObjPatchFanin( pObj, Abc_ObjFanin0(pObj), pInv );
        Counter++;
    }
    printf( "Replaced %d buffers by invertor pairs.\n", Counter );
}